

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

int Am_Connection::Merge_Mask(fd_set *fds)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Connection_List_Ptr local_18;
  Connection_List_Ptr place_holder;
  fd_set *fds_local;
  
  fds->fds_bits[m_parent_socket / 0x40] =
       1L << ((byte)((long)m_parent_socket % 0x40) & 0x3f) | fds->fds_bits[m_parent_socket / 0x40];
  if (num_sockets != 0) {
    for (local_18 = connection_list; local_18 != (Connection_List_Ptr)0x0; local_18 = local_18->next
        ) {
      bVar1 = Connected(local_18->connection_ptr);
      if (bVar1) {
        iVar2 = Get_Socket(local_18->connection_ptr);
        iVar3 = Get_Socket(local_18->connection_ptr);
        fds->fds_bits[iVar3 / 0x40] =
             1L << ((byte)((long)iVar2 % 0x40) & 0x3f) | fds->fds_bits[iVar3 / 0x40];
        iVar2 = Get_Socket(local_18->connection_ptr);
        if (max_socket < iVar2) {
          max_socket = Get_Socket(local_18->connection_ptr);
        }
      }
    }
  }
  return max_socket + 1;
}

Assistant:

int
Am_Connection::Merge_Mask(fd_set *fds)
{
  Connection_List_Ptr place_holder;
  FD_SET(m_parent_socket, fds);
  if (num_sockets != 0) {
    place_holder = connection_list;
    while (place_holder != nullptr) {
      ;
      //                     fds) <<std::flush;
      if (place_holder->connection_ptr->Connected()) {
        FD_SET(place_holder->connection_ptr->Get_Socket(), fds);
        if (place_holder->connection_ptr->Get_Socket() > max_socket)
          max_socket = place_holder->connection_ptr->Get_Socket();
      }
      //else
      place_holder = place_holder->next;
    }
  }
  return max_socket + 1;
}